

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int ctl_lookupbymib(tsdn_t *tsdn,ctl_named_node_t **ending_nodep,size_t *mib,size_t miblen)

{
  ctl_named_node_t *pcVar1;
  ctl_indexed_node_t *pcVar2;
  ulong in_RCX;
  size_t *in_RDX;
  undefined8 *in_RSI;
  tsdn_t *in_RDI;
  ctl_indexed_node_t *inode;
  size_t i;
  ctl_named_node_t *node;
  int ret;
  ulong index;
  ctl_named_node_t *node_00;
  
  node_00 = super_root_node;
  index = 0;
  do {
    if (in_RCX <= index) {
      *in_RSI = node_00;
      return 0;
    }
    pcVar1 = ctl_named_node(node_00->children);
    if (pcVar1 == (ctl_named_node_t *)0x0) {
      pcVar2 = ctl_indexed_node(node_00->children);
      node_00 = (*pcVar2->index)(in_RDI,in_RDX,in_RCX,in_RDX[index]);
      if (node_00 == (ctl_named_node_t *)0x0) {
        return 2;
      }
    }
    else {
      if (node_00->nchildren <= in_RDX[index]) {
        return 2;
      }
      node_00 = ctl_named_children(node_00,index);
    }
    index = index + 1;
  } while( true );
}

Assistant:

static int
ctl_lookupbymib(tsdn_t *tsdn, const ctl_named_node_t **ending_nodep,
    const size_t *mib, size_t miblen) {
	int ret;

	const ctl_named_node_t *node = super_root_node;
	for (size_t i = 0; i < miblen; i++) {
		assert(node);
		assert(node->nchildren > 0);
		if (ctl_named_node(node->children) != NULL) {
			/* Children are named. */
			if (node->nchildren <= mib[i]) {
				ret = ENOENT;
				goto label_return;
			}
			node = ctl_named_children(node, mib[i]);
		} else {
			const ctl_indexed_node_t *inode;

			/* Indexed element. */
			inode = ctl_indexed_node(node->children);
			node = inode->index(tsdn, mib, miblen, mib[i]);
			if (node == NULL) {
				ret = ENOENT;
				goto label_return;
			}
		}
	}
	assert(ending_nodep != NULL);
	*ending_nodep = node;
	ret = 0;

label_return:
	return(ret);
}